

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::RewriteDebugDeclares
          (LocalSingleStoreElimPass *this,Instruction *store_inst,uint32_t var_id)

{
  bool bVar1;
  bool bVar2;
  uint32_t value_id;
  DebugInfoManager *pDVar3;
  
  value_id = Instruction::GetSingleWordInOperand(store_inst,1);
  pDVar3 = IRContext::get_debug_info_mgr((this->super_Pass).context_);
  bVar1 = analysis::DebugInfoManager::AddDebugValueForVariable
                    (pDVar3,store_inst,var_id,value_id,store_inst);
  pDVar3 = IRContext::get_debug_info_mgr((this->super_Pass).context_);
  bVar2 = analysis::DebugInfoManager::KillDebugDeclares(pDVar3,var_id);
  return bVar2 || bVar1;
}

Assistant:

bool LocalSingleStoreElimPass::RewriteDebugDeclares(Instruction* store_inst,
                                                    uint32_t var_id) {
  uint32_t value_id = store_inst->GetSingleWordInOperand(1);
  bool modified = context()->get_debug_info_mgr()->AddDebugValueForVariable(
      store_inst, var_id, value_id, store_inst);
  modified |= context()->get_debug_info_mgr()->KillDebugDeclares(var_id);
  return modified;
}